

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::remove_web_seed_iter(torrent *this,iterator web)

{
  bool bVar1;
  pointer pwVar2;
  undefined8 uVar3;
  piece_picker *this_00;
  peer_connection_interface *local_60;
  const_iterator local_40;
  undefined1 local_31;
  error_code local_30;
  peer_connection_interface *local_20;
  peer_connection *peer;
  torrent *this_local;
  iterator web_local;
  
  peer = (peer_connection *)this;
  this_local = (torrent *)web._M_node;
  pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                     ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
  if ((pwVar2->resolving & 1U) == 0) {
    ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
              ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
    uVar3 = ::std::__cxx11::string::c_str();
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"removing web seed: \"%s\"",uVar3);
    pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                       ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
    local_60 = (pwVar2->peer_info).super_torrent_peer.connection;
    if (local_60 == (peer_connection_interface *)0x0) {
      local_60 = (peer_connection_interface *)0x0;
    }
    else {
      local_60 = local_60 + -0x10;
    }
    local_20 = local_60;
    if (local_60 != (peer_connection_interface *)0x0) {
      boost::system::error_code::error_code<boost::asio::error::basic_errors>
                (&local_30,operation_aborted,(type *)0x0);
      local_31 = 0;
      (*local_60->_vptr_peer_connection_interface[0x14])(local_60,&local_30,1,0);
      (*local_20->_vptr_peer_connection_interface[6])(local_20,0);
    }
    bVar1 = has_picker(this);
    if (bVar1) {
      this_00 = picker(this);
      pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                         ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
      piece_picker::clear_peer(this_00,&(pwVar2->peer_info).super_torrent_peer);
    }
    ::std::_List_const_iterator<libtorrent::aux::web_seed_t>::_List_const_iterator
              (&local_40,(iterator *)&this_local);
    ::std::__cxx11::list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
    ::erase(&this->m_web_seeds,local_40);
  }
  else {
    pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                       ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
    pwVar2->removed = true;
  }
  update_want_tick(this);
  return;
}

Assistant:

void torrent::remove_web_seed_iter(std::list<web_seed_t>::iterator web)
	{
		if (web->resolving)
		{
			web->removed = true;
		}
		else
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("removing web seed: \"%s\"", web->url.c_str());
#endif

			auto* peer = static_cast<peer_connection*>(web->peer_info.connection);
			if (peer != nullptr)
			{
				// if we have a connection for this web seed, we also need to
				// disconnect it and clear its reference to the peer_info object
				// that's part of the web_seed_t we're about to remove
				TORRENT_ASSERT(peer->m_in_use == 1337);
				peer->disconnect(boost::asio::error::operation_aborted, operation_t::bittorrent);
				peer->set_peer_info(nullptr);
			}
			if (has_picker()) picker().clear_peer(&web->peer_info);

			m_web_seeds.erase(web);
		}

		update_want_tick();
	}